

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common_functions.h
# Opt level: O1

void TestPUMADP_histOptions(Arguments *args)

{
  long *plVar1;
  PlanningUnitMADPDiscreteParameters params;
  ProblemDecTiger pdt;
  TestPU pu;
  TestPU pu_all;
  undefined8 local_901;
  undefined1 local_8f9;
  undefined8 local_8f8;
  undefined1 local_8f0;
  undefined8 local_8e8;
  undefined1 local_8e0;
  ProblemDecTiger local_8d8;
  undefined **local_688 [5];
  undefined **local_660;
  undefined **local_358 [5];
  undefined **local_330;
  
  PlanningUnitMADPDiscreteParameters::PlanningUnitMADPDiscreteParameters
            ((PlanningUnitMADPDiscreteParameters *)&local_901);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"TestPUMADP_histOptions ",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"---------------------- ",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  ProblemDecTiger::ProblemDecTiger(&local_8d8);
  PlanningUnitMADPDiscreteParameters::SetComputeAll(SUB81(&local_901,0));
  local_8e8 = local_901;
  local_8e0 = local_8f9;
  PlanningUnitMADPDiscrete::PlanningUnitMADPDiscrete
            ((PlanningUnitMADPDiscrete *)local_358,3,
             (MultiAgentDecisionProcessDiscreteInterface *)
             (&local_8d8.super_DecPOMDPDiscrete + *(long *)(local_8d8._0_8_ + -0x48)),
             (PlanningUnitMADPDiscreteParameters *)&local_8e8);
  local_358[0] = &PTR__PlanningUnitMADPDiscrete_00120980;
  local_330 = &PTR__TestPU_00120a28;
  PlanningUnitMADPDiscreteParameters::~PlanningUnitMADPDiscreteParameters
            ((PlanningUnitMADPDiscreteParameters *)&local_8e8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"->Planning Unit with everything generated",0x29);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-----------------------------------------",0x29);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  PlanningUnitMADPDiscrete::Print();
  PlanningUnitMADPDiscreteParameters::SetComputeAll(SUB81(&local_901,0));
  local_8f8 = local_901;
  local_8f0 = local_8f9;
  PlanningUnitMADPDiscrete::PlanningUnitMADPDiscrete
            ((PlanningUnitMADPDiscrete *)local_688,3,
             (MultiAgentDecisionProcessDiscreteInterface *)
             (&local_8d8.super_DecPOMDPDiscrete + *(long *)(local_8d8._0_8_ + -0x48)),
             (PlanningUnitMADPDiscreteParameters *)&local_8f8);
  local_688[0] = &PTR__PlanningUnitMADPDiscrete_00120980;
  local_660 = &PTR__TestPU_00120a28;
  PlanningUnitMADPDiscreteParameters::~PlanningUnitMADPDiscreteParameters
            ((PlanningUnitMADPDiscreteParameters *)&local_8f8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"->Planning Unit with nothing generated",0x26);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--------------------------------------",0x26);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  PlanningUnitMADPDiscrete::Print();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"TestPUMADP_histOptions ended ",0x1d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  plVar1 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  plVar1 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  plVar1 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  plVar1 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  if (args->testMode == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"press <enter> to continue...",0x1c);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    std::istream::get();
  }
  PlanningUnitMADPDiscrete::~PlanningUnitMADPDiscrete((PlanningUnitMADPDiscrete *)local_688);
  PlanningUnitMADPDiscrete::~PlanningUnitMADPDiscrete((PlanningUnitMADPDiscrete *)local_358);
  DecPOMDPDiscrete::~DecPOMDPDiscrete(&local_8d8.super_DecPOMDPDiscrete);
  PlanningUnitMADPDiscreteParameters::~PlanningUnitMADPDiscreteParameters
            ((PlanningUnitMADPDiscreteParameters *)&local_901);
  return;
}

Assistant:

void  TestPUMADP_histOptions(const ArgumentHandlers::Arguments& args)
{
    int h = 3;
    PlanningUnitMADPDiscreteParameters params;

    cout << "TestPUMADP_histOptions "<<endl;
    cout << "---------------------- "<<endl;
    ProblemDecTiger pdt;
   params.SetComputeAll(true);
    TestPU pu_all (params, h, &pdt);
    cout << "->Planning Unit with everything generated"<< endl;
    cout << "-----------------------------------------"<< endl;
    pu_all.Print();

    params.SetComputeAll(false);
    TestPU pu (params, h, &pdt);
    cout << "->Planning Unit with nothing generated"<< endl;
    cout << "--------------------------------------"<< endl;
    pu.Print();
    cout << "TestPUMADP_histOptions ended "<<endl<<endl<<endl<<endl<<endl;

    if (!args.testMode)
    {
        cout << "press <enter> to continue..."<<endl;
        cin.get();
    }
}